

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFanout.c
# Opt level: O2

void Fraig_NodeAddFaninFanout(Fraig_Node_t *pFanin,Fraig_Node_t *pFanout)

{
  Fraig_Node_t *pFVar1;
  uint __line;
  Fraig_Node_t *pFVar2;
  long lVar3;
  char *__assertion;
  Fraig_Node_t **ppFVar4;
  
  if (((ulong)pFanin & 1) == 0) {
    if (((ulong)pFanout & 1) == 0) {
      pFVar2 = (Fraig_Node_t *)((ulong)pFanout->p1 & 0xfffffffffffffffe);
      if ((pFVar2 == pFanin) ||
         ((Fraig_Node_t *)((ulong)pFanout->p2 & 0xfffffffffffffffe) == pFanin)) {
        pFVar1 = pFanin->pFanPivot;
        if (pFVar1 == (Fraig_Node_t *)0x0) {
          ppFVar4 = &pFanin->pFanPivot;
        }
        else {
          if ((Fraig_Node_t *)((ulong)pFVar1->p1 & 0xfffffffffffffffe) == pFanin) {
            lVar3 = 0x90;
          }
          else {
            lVar3 = 0x98;
            if ((Fraig_Node_t *)((ulong)pFVar1->p2 & 0xfffffffffffffffe) != pFanin) {
              __assertion = "Fraig_Regular(pPivot->p2) == pFanin";
              __line = 0x4c;
              goto LAB_004eafcd;
            }
          }
          ppFVar4 = (Fraig_Node_t **)((long)&pFVar1->Num + lVar3);
          (&pFanout->pFanFanin1)[pFVar2 != pFanin] = *(Fraig_Node_t **)((long)&pFVar1->Num + lVar3);
        }
        *ppFVar4 = pFanout;
        return;
      }
      __assertion = "Fraig_Regular(pFanout->p1) == pFanin || Fraig_Regular(pFanout->p2) == pFanin";
      __line = 0x34;
    }
    else {
      __assertion = "!Fraig_IsComplement(pFanout)";
      __line = 0x33;
    }
  }
  else {
    __assertion = "!Fraig_IsComplement(pFanin)";
    __line = 0x32;
  }
LAB_004eafcd:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigFanout.c"
                ,__line,"void Fraig_NodeAddFaninFanout(Fraig_Node_t *, Fraig_Node_t *)");
}

Assistant:

void Fraig_NodeAddFaninFanout( Fraig_Node_t * pFanin, Fraig_Node_t * pFanout )
{
    Fraig_Node_t * pPivot;

    // pFanins is a fanin of pFanout
    assert( !Fraig_IsComplement(pFanin) );
    assert( !Fraig_IsComplement(pFanout) );
    assert( Fraig_Regular(pFanout->p1) == pFanin || Fraig_Regular(pFanout->p2) == pFanin );

    pPivot = pFanin->pFanPivot;
    if ( pPivot == NULL )
    {
        pFanin->pFanPivot = pFanout;
        return;
    }

    if ( Fraig_Regular(pPivot->p1) == pFanin )
    {
        if ( Fraig_Regular(pFanout->p1) == pFanin )
        {
            pFanout->pFanFanin1 = pPivot->pFanFanin1;
            pPivot->pFanFanin1  = pFanout;
        }
        else // if ( Fraig_Regular(pFanout->p2) == pFanin )
        {
            pFanout->pFanFanin2 = pPivot->pFanFanin1;
            pPivot->pFanFanin1  = pFanout;
        }
    }
    else // if ( Fraig_Regular(pPivot->p2) == pFanin )
    {
        assert( Fraig_Regular(pPivot->p2) == pFanin );
        if ( Fraig_Regular(pFanout->p1) == pFanin )
        {
            pFanout->pFanFanin1 = pPivot->pFanFanin2;
            pPivot->pFanFanin2  = pFanout;
        }
        else // if ( Fraig_Regular(pFanout->p2) == pFanin )
        {
            pFanout->pFanFanin2 = pPivot->pFanFanin2;
            pPivot->pFanFanin2  = pFanout;
        }
    }
}